

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

void __thiscall
diligent_spirv_cross::CompilerGLSL::force_temporary_and_recompile(CompilerGLSL *this,uint32_t id)

{
  undefined1 in_DL;
  byte extraout_DL;
  undefined7 in_register_00000011;
  pair<std::__detail::_Node_iterator<unsigned_int,_true,_false>,_bool> res;
  uint32_t id_local;
  CompilerGLSL *this_local;
  
  res._12_4_ = id;
  ::std::
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  ::insert((pair<std::__detail::_Node_iterator<unsigned_int,_true,_false>,_bool> *)
           &(this->super_Compiler).forced_temporaries,
           (unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
            *)&res.field_0xc,(value_type *)CONCAT71(in_register_00000011,in_DL));
  if ((extraout_DL & 1) == 0) {
    Compiler::force_recompile(&this->super_Compiler);
  }
  else {
    Compiler::force_recompile_guarantee_forward_progress(&this->super_Compiler);
  }
  return;
}

Assistant:

void CompilerGLSL::force_temporary_and_recompile(uint32_t id)
{
	auto res = forced_temporaries.insert(id);

	// Forcing new temporaries guarantees forward progress.
	if (res.second)
		force_recompile_guarantee_forward_progress();
	else
		force_recompile();
}